

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O2

idx_t duckdb::FindOrderedRangeBound<true>
                (WindowCursor *range_lo,WindowCursor *range_hi,OrderType range_sense,
                idx_t order_begin,idx_t order_end,WindowBoundary range,
                WindowInputExpression *boundary,idx_t chunk_idx,FrameBounds *prev)

{
  idx_t iVar1;
  InternalException *this;
  int iVar2;
  undefined7 in_register_00000011;
  allocator local_39;
  string local_38;
  
  iVar2 = (int)CONCAT71(in_register_00000011,range_sense);
  if (iVar2 == 3) {
    iVar1 = FindRangeBound<duckdb::GreaterThan,true>
                      (range_lo,range_hi,order_begin,order_end,range,boundary,chunk_idx,prev);
  }
  else {
    if (iVar2 != 2) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Unsupported ORDER BY sense for RANGE",&local_39);
      InternalException::InternalException(this,&local_38);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar1 = FindRangeBound<duckdb::LessThan,true>
                      (range_lo,range_hi,order_begin,order_end,range,boundary,chunk_idx,prev);
  }
  return iVar1;
}

Assistant:

static idx_t FindOrderedRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const OrderType range_sense,
                                   const idx_t order_begin, const idx_t order_end, const WindowBoundary range,
                                   WindowInputExpression &boundary, const idx_t chunk_idx, const FrameBounds &prev) {
	switch (range_sense) {
	case OrderType::ASCENDING:
		return FindRangeBound<LessThan, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary, chunk_idx,
		                                      prev);
	case OrderType::DESCENDING:
		return FindRangeBound<GreaterThan, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary, chunk_idx,
		                                         prev);
	default:
		throw InternalException("Unsupported ORDER BY sense for RANGE");
	}
}